

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLGETNAMEDBUFFERPARAMETERIVPROC epoxy_glGetNamedBufferParameteriv_resolver(void)

{
  PFNGLGETNAMEDBUFFERPARAMETERIVPROC p_Var1;
  
  p_Var1 = (PFNGLGETNAMEDBUFFERPARAMETERIVPROC)
           gl_provider_resolver
                     ("glGetNamedBufferParameteriv",
                      epoxy_glGetNamedBufferParameteriv_resolver::providers,
                      epoxy_glGetNamedBufferParameteriv_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLGETNAMEDBUFFERPARAMETERIVPROC
epoxy_glGetNamedBufferParameteriv_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        20610 /* "glGetNamedBufferParameteriv" */,
        20610 /* "glGetNamedBufferParameteriv" */,
    };
    return gl_provider_resolver(entrypoint_strings + 20610 /* "glGetNamedBufferParameteriv" */,
                                providers, entrypoints);
}